

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O0

wchar_t tty_get_signal_character(EditLine *el,wchar_t sig)

{
  tcflag_t *ptVar1;
  tcflag_t *ed;
  wchar_t sig_local;
  EditLine *el_local;
  
  ptVar1 = tty__get_flag(&(el->el_tty).t_ed,L'\0');
  if ((*ptVar1 & 0x200) == 0) {
    el_local._4_4_ = L'\xffffffff';
  }
  else if (sig == L'\x02') {
    el_local._4_4_ = (wchar_t)(el->el_tty).t_c[1][0];
  }
  else if (sig == L'\x03') {
    el_local._4_4_ = (wchar_t)(el->el_tty).t_c[1][1];
  }
  else if (sig == L'\x14') {
    el_local._4_4_ = (wchar_t)(el->el_tty).t_c[1][10];
  }
  else {
    el_local._4_4_ = L'\xffffffff';
  }
  return el_local._4_4_;
}

Assistant:

libedit_private int
tty_get_signal_character(EditLine *el, int sig)
{
#ifdef ECHOCTL
	tcflag_t *ed = tty__get_flag(&el->el_tty.t_ed, MD_INP);
	if ((*ed & ECHOCTL) == 0)
		return -1;
#endif
	switch (sig) {
#if defined(SIGINT) && defined(VINTR)
	case SIGINT:
		return el->el_tty.t_c[ED_IO][VINTR];
#endif
#if defined(SIGQUIT) && defined(VQUIT)
	case SIGQUIT:
		return el->el_tty.t_c[ED_IO][VQUIT];
#endif
#if defined(SIGINFO) && defined(VSTATUS)
	case SIGINFO:
		return el->el_tty.t_c[ED_IO][VSTATUS];
#endif
#if defined(SIGTSTP) && defined(VSUSP)
	case SIGTSTP:
		return el->el_tty.t_c[ED_IO][VSUSP];
#endif
	default:
		return -1;
	}
}